

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

LogEst sqlite3LogEstFromDouble(double x)

{
  LogEst e;
  u64 a;
  double x_local;
  
  if (1.0 < x) {
    if (2000000000.0 < x) {
      x_local._6_2_ = ((ushort)((ulong)x >> 0x34) - 0x3fe) * 10;
    }
    else {
      x_local._6_2_ = sqlite3LogEst((long)x | (long)(x - 9.223372036854776e+18) & (long)x >> 0x3f);
    }
  }
  else {
    x_local._6_2_ = 0;
  }
  return x_local._6_2_;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEstFromDouble(double x){
  u64 a;
  LogEst e;
  assert( sizeof(x)==8 && sizeof(a)==8 );
  if( x<=1 ) return 0;
  if( x<=2000000000 ) return sqlite3LogEst((u64)x);
  memcpy(&a, &x, 8);
  e = (a>>52) - 1022;
  return e*10;
}